

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poll.c
# Opt level: O0

void uv__poll_io(uv_loop_t *loop,uv__io_t *w,uint events)

{
  uv_loop_t *loop_00;
  uint in_EDX;
  long in_RSI;
  byte bVar1;
  int pevents;
  uv_poll_t *handle;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  
  loop_00 = (uv_loop_t *)(in_RSI + -0x48);
  if ((in_EDX & 8) == 0) {
    bVar1 = (in_EDX & 1) != 0;
    if ((in_EDX & 4) != 0) {
      bVar1 = bVar1 | 2;
    }
    (**(code **)(in_RSI + -8))(loop_00,0,bVar1);
  }
  else {
    uv__io_stop(loop_00,(uv__io_t *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),0)
    ;
    if (((loop_00->stop_flag & 0x4000) != 0) &&
       (loop_00->stop_flag = loop_00->stop_flag & 0xffffbfff, (loop_00->stop_flag & 0x2000) != 0)) {
      *(int *)((long)loop_00->handle_queue[0] + 8) =
           *(int *)((long)loop_00->handle_queue[0] + 8) + -1;
    }
    (**(code **)&loop_00->backend_fd)(loop_00,0xfffffff7,0);
  }
  return;
}

Assistant:

static void uv__poll_io(uv_loop_t* loop, uv__io_t* w, unsigned int events) {
  uv_poll_t* handle;
  int pevents;

  handle = container_of(w, uv_poll_t, io_watcher);

  if (events & UV__POLLERR) {
    uv__io_stop(loop, w, UV__POLLIN | UV__POLLOUT);
    uv__handle_stop(handle);
    handle->poll_cb(handle, -EBADF, 0);
    return;
  }

  pevents = 0;
  if (events & UV__POLLIN)
    pevents |= UV_READABLE;
  if (events & UV__POLLOUT)
    pevents |= UV_WRITABLE;

  handle->poll_cb(handle, 0, pevents);
}